

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_cmpxchgb_mmu_x86_64
                   (CPUArchState *env,target_ulong addr,uint32_t cmpv,uint32_t newv,TCGMemOpIdx oi,
                   uintptr_t retaddr)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  undefined1 local_3a;
  uchar _old;
  uint8_t ret;
  uint8_t *haddr;
  uintptr_t retaddr_local;
  undefined1 local_20;
  TCGMemOpIdx oi_local;
  uint32_t newv_local;
  uint32_t cmpv_local;
  target_ulong addr_local;
  CPUArchState *env_local;
  
  pbVar2 = (byte *)atomic_mmu_lookup(env,addr,oi,retaddr);
  oi_local._0_1_ = (byte)cmpv;
  local_3a = (byte)oi_local;
  local_20 = (byte)newv;
  LOCK();
  bVar1 = *pbVar2;
  bVar3 = (byte)oi_local == bVar1;
  if (bVar3) {
    *pbVar2 = local_20;
    bVar1 = (byte)oi_local;
  }
  UNLOCK();
  if (!bVar3) {
    local_3a = bVar1;
  }
  return (uint32_t)local_3a;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}